

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddLibraryCommand::Clone(cmAddLibraryCommand *this)

{
  cmCommand *this_00;
  cmAddLibraryCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmAddLibraryCommand((cmAddLibraryCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmAddLibraryCommand; }